

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckySwap.c
# Opt level: O1

void Kit_TruthCountOnesInCofs_64bit(word *pTruth,int nVars,int *pStore)

{
  ulong uVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  
  uVar3 = 1 << ((char)nVars - 6U & 0x1f);
  memset(pStore,0,(long)nVars * 4);
  if (nVars < 7) {
    if (0 < nVars) {
      uVar1 = (*pTruth >> 2 & 0x1111111111111111) + (*pTruth & 0x1111111111111111);
      uVar1 = (uVar1 >> 4) + uVar1 & 0x707070707070707;
      uVar1 = (uVar1 >> 8) + uVar1;
      lVar2 = (uVar1 >> 0x10) + uVar1;
      *pStore = (int)((ulong)lVar2 >> 0x20) + (int)lVar2 & 0xff;
    }
    if (1 < nVars) {
      uVar1 = (*pTruth & 0x3333333333333333) - (*pTruth >> 1 & 0x1111111111111111);
      uVar1 = (uVar1 >> 2 & 0x3333333333333333) + (uVar1 & 0x3333333333333333);
      uVar1 = (uVar1 >> 4) + uVar1 & 0xf0f0f0f0f0f0f0f;
      uVar1 = (uVar1 >> 8) + uVar1;
      lVar2 = (uVar1 >> 0x10) + uVar1;
      pStore[1] = (int)((ulong)lVar2 >> 0x20) + (int)lVar2 & 0xff;
    }
    if (2 < nVars) {
      uVar1 = (*pTruth & 0xf0f0f0f0f0f0f0f) - (*pTruth >> 1 & 0x505050505050505);
      uVar1 = (uVar1 >> 2 & 0x3333333333333333) + (uVar1 & 0x3333333333333333);
      uVar1 = (uVar1 >> 4) + uVar1 & 0xf0f0f0f0f0f0f0f;
      uVar1 = (uVar1 >> 8) + uVar1;
      lVar2 = (uVar1 >> 0x10) + uVar1;
      pStore[2] = (int)((ulong)lVar2 >> 0x20) + (int)lVar2 & 0xff;
    }
    if (3 < nVars) {
      uVar1 = (*pTruth & 0xff00ff00ff00ff) - (*pTruth >> 1 & 0x55005500550055);
      uVar1 = (uVar1 >> 2 & 0x3333333333333333) + (uVar1 & 0x3333333333333333);
      uVar1 = (uVar1 >> 4) + uVar1 & 0xf0f0f0f0f0f0f0f;
      uVar1 = (uVar1 >> 8) + uVar1;
      lVar2 = (uVar1 >> 0x10) + uVar1;
      pStore[3] = (int)((ulong)lVar2 >> 0x20) + (int)lVar2 & 0xff;
    }
    if (4 < nVars) {
      uVar1 = (*pTruth & 0xffff0000ffff) - (*pTruth >> 1 & 0x555500005555);
      uVar1 = (uVar1 >> 2 & 0x3333333333333333) + (uVar1 & 0x3333333333333333);
      uVar1 = (uVar1 >> 4) + uVar1 & 0xf0f0f0f0f0f0f0f;
      uVar1 = (uVar1 >> 8) + uVar1;
      lVar2 = (uVar1 >> 0x10) + uVar1;
      pStore[4] = (int)((ulong)lVar2 >> 0x20) + (int)lVar2 & 0xff;
    }
    if (nVars == 6) {
      uVar1 = (*pTruth & 0xffffffff) - (ulong)((uint)*pTruth >> 1 & 0x55555555);
      uVar1 = (uVar1 >> 2 & 0x3333333333333333) + (uVar1 & 0x3333333333333333);
      uVar1 = (uVar1 >> 4) + uVar1 & 0xf0f0f0f0f0f0f0f;
      uVar1 = (uVar1 >> 8) + uVar1;
      lVar2 = (uVar1 >> 0x10) + uVar1;
      pStore[5] = (int)((ulong)lVar2 >> 0x20) + (int)lVar2 & 0xff;
    }
  }
  else {
    if (0 < (int)uVar3) {
      uVar1 = 0;
      do {
        uVar8 = pTruth[uVar1] - (pTruth[uVar1] >> 1 & 0x5555555555555555);
        uVar8 = (uVar8 >> 2 & 0x3333333333333333) + (uVar8 & 0x3333333333333333);
        uVar8 = (uVar8 >> 4) + uVar8 & 0xf0f0f0f0f0f0f0f;
        uVar8 = (uVar8 >> 8) + uVar8;
        lVar2 = (uVar8 >> 0x10) + uVar8;
        lVar10 = 0;
        do {
          if (((uint)uVar1 >> ((uint)lVar10 & 0x1f) & 1) == 0) {
            pStore[lVar10 + 6] =
                 pStore[lVar10 + 6] + ((int)((ulong)lVar2 >> 0x20) + (int)lVar2 & 0xffU);
          }
          lVar10 = lVar10 + 1;
        } while ((ulong)(uint)nVars - 6 != lVar10);
        uVar1 = uVar1 + 1;
      } while (uVar1 != uVar3);
    }
    if (1 < (int)uVar3) {
      iVar12 = *pStore;
      iVar13 = pStore[1];
      iVar11 = pStore[2];
      iVar9 = pStore[3];
      iVar7 = pStore[4];
      iVar6 = pStore[5];
      iVar4 = (uVar3 >> 1) + 1;
      do {
        uVar1 = *pTruth;
        uVar8 = pTruth[1];
        uVar5 = ((uVar8 & 0xd555555555555555) * 2 + (uVar1 & 0x5555555555555555)) -
                (uVar8 & 0x5555555555555555);
        uVar5 = (uVar5 >> 2 & 0x3333333333333333) + (uVar5 & 0x3333333333333333);
        uVar5 = (uVar5 >> 4) + uVar5 & 0xf0f0f0f0f0f0f0f;
        uVar5 = (uVar5 >> 8) + uVar5;
        lVar2 = (uVar5 >> 0x10) + uVar5;
        iVar12 = iVar12 + ((int)((ulong)lVar2 >> 0x20) + (int)lVar2 & 0xffU);
        uVar5 = (uVar8 & 0xf333333333333333) * 4 + (uVar1 & 0x3333333333333333);
        uVar5 = uVar5 - (uVar5 >> 1 & 0x5555555555555555);
        uVar5 = (uVar5 >> 2 & 0x3333333333333333) + (uVar5 & 0x3333333333333333);
        uVar5 = (uVar5 >> 4) + uVar5 & 0xf0f0f0f0f0f0f0f;
        uVar5 = (uVar5 >> 8) + uVar5;
        lVar2 = (uVar5 >> 0x10) + uVar5;
        iVar13 = iVar13 + ((int)((ulong)lVar2 >> 0x20) + (int)lVar2 & 0xffU);
        uVar5 = (uVar8 & 0xf0f0f0f0f0f0f0f) << 4 | uVar1 & 0xf0f0f0f0f0f0f0f;
        uVar5 = uVar5 - (uVar5 >> 1 & 0x5555555555555555);
        uVar5 = (uVar5 >> 2 & 0x3333333333333333) + (uVar5 & 0x3333333333333333);
        uVar5 = (uVar5 >> 4) + uVar5 & 0xf0f0f0f0f0f0f0f;
        uVar5 = (uVar5 >> 8) + uVar5;
        lVar2 = (uVar5 >> 0x10) + uVar5;
        iVar11 = iVar11 + ((int)((ulong)lVar2 >> 0x20) + (int)lVar2 & 0xffU);
        uVar5 = (uVar8 & 0xff00ff00ff00ff) << 8 | uVar1 & 0xff00ff00ff00ff;
        uVar5 = uVar5 - (uVar5 >> 1 & 0x5555555555555555);
        uVar5 = (uVar5 >> 2 & 0x3333333333333333) + (uVar5 & 0x3333333333333333);
        uVar5 = (uVar5 >> 4) + uVar5 & 0xf0f0f0f0f0f0f0f;
        uVar5 = (uVar5 >> 8) + uVar5;
        lVar2 = (uVar5 >> 0x10) + uVar5;
        iVar9 = iVar9 + ((int)((ulong)lVar2 >> 0x20) + (int)lVar2 & 0xffU);
        uVar5 = (uVar8 & 0xffff0000ffff) << 0x10 | uVar1 & 0xffff0000ffff;
        uVar5 = uVar5 - (uVar5 >> 1 & 0x5555555555555555);
        uVar5 = (uVar5 >> 2 & 0x3333333333333333) + (uVar5 & 0x3333333333333333);
        uVar5 = (uVar5 >> 4) + uVar5 & 0xf0f0f0f0f0f0f0f;
        uVar5 = (uVar5 >> 8) + uVar5;
        lVar2 = (uVar5 >> 0x10) + uVar5;
        iVar7 = iVar7 + ((int)((ulong)lVar2 >> 0x20) + (int)lVar2 & 0xffU);
        uVar1 = uVar8 << 0x20 | uVar1 & 0xffffffff;
        uVar1 = uVar1 - (uVar1 >> 1 & 0x5555555555555555);
        uVar1 = (uVar1 >> 2 & 0x3333333333333333) + (uVar1 & 0x3333333333333333);
        uVar1 = (uVar1 >> 4) + uVar1 & 0xf0f0f0f0f0f0f0f;
        uVar1 = (uVar1 >> 8) + uVar1;
        lVar2 = (uVar1 >> 0x10) + uVar1;
        iVar6 = iVar6 + ((int)((ulong)lVar2 >> 0x20) + (int)lVar2 & 0xffU);
        pTruth = pTruth + 2;
        iVar4 = iVar4 + -1;
      } while (1 < iVar4);
      *pStore = iVar12;
      pStore[1] = iVar13;
      pStore[2] = iVar11;
      pStore[3] = iVar9;
      pStore[4] = iVar7;
      pStore[5] = iVar6;
    }
  }
  return;
}

Assistant:

void Kit_TruthCountOnesInCofs_64bit( word * pTruth, int nVars, int * pStore )
{    
    int nWords = Kit_TruthWordNum_64bit( nVars );
    int i, k, Counter;
    memset( pStore, 0, sizeof(int) * nVars );
    if ( nVars <= 6 )
    {
        if ( nVars > 0 )        
            pStore[0] = Kit_WordCountOnes_64bit( pTruth[0] & ABC_CONST(0x5555555555555555) );  
        if ( nVars > 1 )       
            pStore[1] = Kit_WordCountOnes_64bit( pTruth[0] & ABC_CONST(0x3333333333333333) );     
        if ( nVars > 2 )       
            pStore[2] = Kit_WordCountOnes_64bit( pTruth[0] & ABC_CONST(0x0F0F0F0F0F0F0F0F) );   
        if ( nVars > 3 )       
            pStore[3] = Kit_WordCountOnes_64bit( pTruth[0] & ABC_CONST(0x00FF00FF00FF00FF) );     
        if ( nVars > 4 )       
            pStore[4] = Kit_WordCountOnes_64bit( pTruth[0] & ABC_CONST(0x0000FFFF0000FFFF) ); 
        if ( nVars > 5 )       
            pStore[5] = Kit_WordCountOnes_64bit( pTruth[0] & ABC_CONST(0x00000000FFFFFFFF) );      
        return;
    }
    // nVars > 6
    // count 1's for all other variables
    for ( k = 0; k < nWords; k++ )
    {
        Counter = Kit_WordCountOnes_64bit( pTruth[k] );
        for ( i = 6; i < nVars; i++ )
            if ( (k & (1 << (i-6))) == 0)
                pStore[i] += Counter;
    }
    // count 1's for the first six variables
    for ( k = nWords/2; k>0; k-- )
    {
        pStore[0] += Kit_WordCountOnes_64bit( (pTruth[0] & ABC_CONST(0x5555555555555555)) | ((pTruth[1] & ABC_CONST(0x5555555555555555)) <<  1) );
        pStore[1] += Kit_WordCountOnes_64bit( (pTruth[0] & ABC_CONST(0x3333333333333333)) | ((pTruth[1] & ABC_CONST(0x3333333333333333)) <<  2) );
        pStore[2] += Kit_WordCountOnes_64bit( (pTruth[0] & ABC_CONST(0x0F0F0F0F0F0F0F0F)) | ((pTruth[1] & ABC_CONST(0x0F0F0F0F0F0F0F0F)) <<  4) );
        pStore[3] += Kit_WordCountOnes_64bit( (pTruth[0] & ABC_CONST(0x00FF00FF00FF00FF)) | ((pTruth[1] & ABC_CONST(0x00FF00FF00FF00FF)) <<  8) );
        pStore[4] += Kit_WordCountOnes_64bit( (pTruth[0] & ABC_CONST(0x0000FFFF0000FFFF)) | ((pTruth[1] & ABC_CONST(0x0000FFFF0000FFFF)) <<  16) );
        pStore[5] += Kit_WordCountOnes_64bit( (pTruth[0] & ABC_CONST(0x00000000FFFFFFFF)) | ((pTruth[1] & ABC_CONST(0x00000000FFFFFFFF)) <<  32) );  
        pTruth += 2;
    }
}